

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

FMFieldList validate_and_copy_field_list(FMFieldList field_list,FMFormat_conflict fmformat)

{
  char **ppcVar1;
  int iVar2;
  undefined4 uVar3;
  FMdata_type FVar4;
  FMFieldList p_Var5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  size_t __nmemb;
  long lVar12;
  int iVar13;
  bool bVar14;
  long elements;
  long local_38;
  
  lVar11 = 1;
  lVar12 = 0;
  p_Var5 = field_list;
  do {
    lVar11 = lVar11 + -1;
    lVar12 = lVar12 + -0x100000000;
    ppcVar1 = &p_Var5->field_name;
    p_Var5 = p_Var5 + 1;
  } while (*ppcVar1 != (char *)0x0);
  p_Var5 = (FMFieldList)ffs_malloc((-lVar12 >> 0x1d) * 3);
  iVar9 = (int)-lVar11;
  if (lVar11 != 0) {
    uVar6 = 1;
    if (1 < iVar9) {
      uVar6 = -lVar11 & 0xffffffff;
    }
    lVar11 = 0;
    do {
      pcVar8 = *(char **)((long)&field_list->field_type + lVar11);
      pcVar7 = strchr(pcVar8,0x5b);
      if (pcVar7 == (char *)0x0) {
        pcVar7 = strchr(pcVar8,0x2a);
        if (pcVar7 != (char *)0x0) {
          iVar2 = fmformat->pointer_size;
          goto LAB_0011ba36;
        }
        FVar4 = FMstr_to_data_type(pcVar8);
        bVar14 = FVar4 == string_type;
        iVar2 = *(int *)((long)&field_list->field_size + lVar11);
      }
      else {
        iVar2 = is_all_static_array_dimens(pcVar8);
        if (iVar2 != 0) {
          pcVar8 = *(char **)((long)&field_list->field_type + lVar11);
          pcVar7 = strchr(pcVar8,0x2a);
          if (pcVar7 == (char *)0x0) {
            FVar4 = FMarray_str_to_data_type(pcVar8,&local_38);
            if ((FVar4 != unknown_type) && (0x10 < *(int *)((long)&field_list->field_size + lVar11))
               ) {
              fprintf(_stderr,
                      "Field size for field %s in format %s is large, check to see if it is valid.\n"
                      ,*(undefined8 *)((long)&field_list->field_name + lVar11),fmformat->format_name
                     );
            }
            iVar2 = (int)local_38 * *(int *)((long)&field_list->field_size + lVar11);
            if (iVar2 < 1) {
              fprintf(_stderr,
                      "Field Size is not positive!  field type \"%s\" base= %d, elements=%ld\n",
                      *(undefined8 *)((long)&field_list->field_type + lVar11));
              return (FMFieldList)0x0;
            }
            bVar14 = FVar4 == string_type;
            goto LAB_0011ba38;
          }
        }
        iVar2 = fmformat->pointer_size;
        if (iVar2 < 1) {
          fprintf(_stderr,"Pointer Size is not positive! BAD! pointer size = %d\n");
          return (FMFieldList)0x0;
        }
LAB_0011ba36:
        bVar14 = false;
      }
LAB_0011ba38:
      iVar13 = *(int *)((long)&field_list->field_offset + lVar11);
      iVar10 = iVar2 + iVar13;
      if (iVar2 + iVar13 < fmformat->record_length) {
        iVar10 = fmformat->record_length;
      }
      fmformat->record_length = iVar10;
      pcVar8 = strdup(*(char **)((long)&field_list->field_name + lVar11));
      *(char **)((long)&p_Var5->field_name + lVar11) = pcVar8;
      if ((fmformat->context->ignore_default_values == 0) &&
         (pcVar8 = strchr(pcVar8,0x28), pcVar8 != (char *)0x0)) {
        *pcVar8 = '\0';
        iVar13 = *(int *)((long)&field_list->field_offset + lVar11);
      }
      pcVar8 = strdup(*(char **)((long)&field_list->field_type + lVar11));
      *(char **)((long)&p_Var5->field_type + lVar11) = pcVar8;
      uVar3 = 8;
      if (!bVar14) {
        uVar3 = *(undefined4 *)((long)&field_list->field_size + lVar11);
      }
      *(undefined4 *)((long)&p_Var5->field_size + lVar11) = uVar3;
      *(int *)((long)&p_Var5->field_offset + lVar11) = iVar13;
      lVar11 = lVar11 + 0x18;
    } while (uVar6 * 0x18 != lVar11);
  }
  __nmemb = -0x100000000 - lVar12 >> 0x20;
  p_Var5[__nmemb].field_name = (char *)0x0;
  p_Var5[__nmemb].field_type = (char *)0x0;
  p_Var5[__nmemb].field_size = 0;
  p_Var5[__nmemb].field_offset = 0;
  fmformat->field_count = iVar9;
  fmformat->field_list = p_Var5;
  qsort(p_Var5,__nmemb,0x18,field_offset_compar);
  return p_Var5;
}

Assistant:

FMFieldList
validate_and_copy_field_list(FMFieldList field_list, FMFormat fmformat)
{
    int field;
    FMFieldList new_field_list;
    int field_count = count_FMfield(field_list);
    new_field_list = (FMFieldList) malloc((size_t) sizeof(FMField) *
					     (field_count + 1));
    for (field = 0; field < field_count; field++) {
	int field_size = 0;
	int simple_string = 0;
	if (strchr(field_list[field].field_type, '[') == NULL) {
	    /* not an array */
	    if (strchr(field_list[field].field_type, '*') == NULL) {
		if (FMstr_to_data_type(field_list[field].field_type) == string_type) {
		    simple_string = 1;
		}
		field_size = field_list[field].field_size;
	    } else {
		field_size = fmformat->pointer_size;
	    }
	} else {
	    int ret = is_var_array_field(field_list, field);
	    if (ret == -1) return NULL;   /* rejected */
	    if ((ret == 1) || (strchr(field_list[field].field_type, '*'))) {
		/* variant array, real_field_size is
		 * fmc->pointer_size */
		field_size = fmformat->pointer_size;
		if (field_size <= 0) {
		    fprintf(stderr, "Pointer Size is not positive! BAD! pointer size = %d\n",
			    fmformat->pointer_size);
		    return NULL;
		}
	    } else {
		long elements;
		FMdata_type base_type;
		
		base_type = FMarray_str_to_data_type(field_list[field].field_type,
						   &elements);
		if ((base_type != unknown_type) &&
		    (field_list[field].field_size > 16)) {
		    fprintf(stderr, "Field size for field %s in format %s is large, check to see if it is valid.\n",
			    field_list[field].field_name, fmformat->format_name);
		}
		field_size = field_list[field].field_size * elements;
		if (field_size <= 0) {
		    fprintf(stderr, "Field Size is not positive!  field type \"%s\" base= %d, elements=%ld\n",
			    field_list[field].field_type,
			    field_list[field].field_size, elements);
		    return NULL;
		}
		if (base_type == string_type) {
		    simple_string = 1;
		}
	    }
	}

	fmformat->record_length = Max(fmformat->record_length,
					 field_list[field].field_offset +
					    field_size);
	new_field_list[field].field_name = strdup(field_list[field].field_name);
	if  (fmformat->context->ignore_default_values) {
	    new_field_list[field].field_name = new_field_list[field].field_name;
	} else {
	    field_name_strip_default((char *)new_field_list[field].field_name);
	}
	new_field_list[field].field_type = strdup(field_list[field].field_type);
	new_field_list[field].field_size = field_list[field].field_size;
	if (simple_string) {
	    new_field_list[field].field_size = sizeof(char*);
	}
	new_field_list[field].field_offset = field_list[field].field_offset;
    }
    new_field_list[field_count].field_name = NULL;
    new_field_list[field_count].field_type = NULL;
    new_field_list[field_count].field_size = 0;
    new_field_list[field_count].field_offset = 0;
    fmformat->field_count = field_count;
    fmformat->field_list = new_field_list;
    qsort(fmformat->field_list, field_count, sizeof(FMField),
	  field_offset_compar);
    return new_field_list;
}